

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

string * __thiscall antlr::BaseAST::toStringList_abi_cxx11_(BaseAST *this)

{
  AST *this_00;
  AST *pAVar1;
  long *in_RSI;
  string *in_RDI;
  string *ts;
  allocator<char> *__a;
  ASTRefCount<antlr::AST> in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  ASTRefCount local_a0 [8];
  string local_98 [32];
  ASTRefCount<antlr::AST> local_78;
  string local_70 [32];
  string local_50 [32];
  ASTRefCount local_30 [30];
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  __a = &local_12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38.ref,__a);
  std::allocator<char>::~allocator(&local_12);
  (**(code **)(*in_RSI + 0x68))(local_30);
  this_00 = ASTRefCount::operator_cast_to_AST_(local_30);
  ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
  if (this_00 == (AST *)0x0) {
    std::__cxx11::string::operator+=((string *)in_RDI," ");
    (**(code **)(*in_RSI + 0xc0))(local_98);
    std::__cxx11::string::operator+=((string *)in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    std::__cxx11::string::operator+=((string *)in_RDI," ( ");
    (**(code **)(*in_RSI + 0xc0))(local_50);
    std::__cxx11::string::operator+=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    (**(code **)(*in_RSI + 0x68))(&local_78);
    pAVar1 = ASTRefCount<antlr::AST>::operator->(&local_78);
    (*pAVar1->_vptr_AST[0x19])(local_70);
    std::__cxx11::string::operator+=((string *)in_RDI,local_70);
    std::__cxx11::string::~string(local_70);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
    std::__cxx11::string::operator+=((string *)in_RDI," )");
  }
  (**(code **)(*in_RSI + 0x70))(local_a0);
  pAVar1 = ASTRefCount::operator_cast_to_AST_(local_a0);
  ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
  if (pAVar1 != (AST *)0x0) {
    (**(code **)(*in_RSI + 0x70))(&stack0xffffffffffffff38);
    pAVar1 = ASTRefCount<antlr::AST>::operator->
                       ((ASTRefCount<antlr::AST> *)&stack0xffffffffffffff38);
    (*pAVar1->_vptr_AST[0x19])(&stack0xffffffffffffff40);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff40);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
  }
  return in_RDI;
}

Assistant:

string BaseAST::toStringList() const
{
	ANTLR_USE_NAMESPACE(std)string ts="";

	if (getFirstChild())
	{
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	}
	else
	{
		ts+=" ";
		ts+=toString();
	}

	if (getNextSibling())
		ts+=getNextSibling()->toStringList();

	return ts;
}